

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

void __thiscall sf2cute::SoundFont::ClearInstruments(SoundFont *this)

{
  bool bVar1;
  __shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  shared_ptr<sf2cute::SFInstrument> *instrument;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  *__range1;
  SoundFont *this_local;
  
  __end1 = std::
           vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
           ::begin(&this->instruments_);
  instrument = (shared_ptr<sf2cute::SFInstrument> *)
               std::
               vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
               ::end(&this->instruments_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                                *)&instrument);
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                 ::operator*(&__end1);
    this_01 = std::
              __shared_ptr_access<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    SFInstrument::reset_parent_file(this_01);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<sf2cute::SFInstrument>_*,_std::vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>_>
    ::operator++(&__end1);
  }
  std::
  vector<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ::clear(&this->instruments_);
  return;
}

Assistant:

void SoundFont::ClearInstruments() noexcept {
  for (const auto & instrument : instruments_) {
    instrument->reset_parent_file();
  }
  instruments_.clear();
}